

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageDrawPixel(Image *dst,int x,int y,Color color)

{
  int iVar1;
  void *pvVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pvVar2 = dst->data;
  if (x < 0 || pvVar2 == (void *)0x0) {
    return;
  }
  iVar1 = dst->width;
  if (y < 0 || iVar1 <= x) {
    return;
  }
  if (dst->height <= y) {
    return;
  }
  if (9 < dst->format - 1U) {
    return;
  }
  uVar6 = (uint)color >> 8;
  uVar4 = (uint)color >> 0x10;
  uVar5 = (uint)color >> 0x18;
  switch(dst->format) {
  case 1:
    *(char *)((long)pvVar2 + (ulong)(uint)x + (ulong)(uint)(iVar1 * y)) =
         (char)(int)((((float)(uVar4 & 0xff) / 255.0) * 0.114 +
                     ((float)((uint)color & 0xff) / 255.0) * 0.299 +
                     ((float)(uVar6 & 0xff) / 255.0) * 0.587) * 255.0);
    break;
  case 2:
    *(char *)((long)pvVar2 + (ulong)(uint)(iVar1 * y + x) * 2) =
         (char)(int)((((float)(uVar4 & 0xff) / 255.0) * 0.114 +
                     ((float)((uint)color & 0xff) / 255.0) * 0.299 +
                     ((float)(uVar6 & 0xff) / 255.0) * 0.587) * 255.0);
    *(uchar *)((long)dst->data + (long)((y * dst->width + x) * 2) + 1) = color.a;
    break;
  case 3:
    fVar7 = roundf(((float)((uint)color & 0xff) / 255.0) * 31.0);
    fVar8 = roundf(((float)(uVar6 & 0xff) / 255.0) * 63.0);
    fVar9 = roundf(((float)(uVar4 & 0xff) / 255.0) * 31.0);
    uVar3 = (ushort)(int)fVar9 & 0xff | (ushort)((int)fVar7 << 0xb) |
            (ushort)(((int)fVar8 & 0xffU) << 5);
    goto LAB_001426c2;
  case 4:
    *(uchar *)((long)pvVar2 + (ulong)(uint)((iVar1 * y + x) * 3)) = color.r;
    *(uchar *)((long)dst->data + (long)(dst->width * y + x) * 3 + 1) = color.g;
    *(uchar *)((long)dst->data + (long)(y * dst->width + x) * 3 + 2) = color.b;
    break;
  case 5:
    fVar7 = roundf(((float)((uint)color & 0xff) / 255.0) * 31.0);
    fVar8 = roundf(((float)(uVar6 & 0xff) / 255.0) * 31.0);
    fVar9 = roundf(((float)(uVar4 & 0xff) / 255.0) * 31.0);
    uVar3 = (ushort)(0.19607843 < (float)uVar5 / 255.0) | (ushort)((int)fVar7 << 0xb) |
            (ushort)(((int)fVar8 & 0xffU) << 6) | ((ushort)(int)fVar9 & 0xff) * 2;
    goto LAB_001426c2;
  case 6:
    fVar7 = roundf(((float)((uint)color & 0xff) / 255.0) * 15.0);
    fVar8 = roundf(((float)(uVar6 & 0xff) / 255.0) * 15.0);
    fVar9 = roundf(((float)(uVar4 & 0xff) / 255.0) * 15.0);
    fVar10 = roundf(((float)uVar5 / 255.0) * 15.0);
    uVar3 = (ushort)(int)fVar10 & 0xff | (ushort)((int)fVar7 << 0xc) | (ushort)((int)fVar8 << 8) |
            (ushort)(((int)fVar9 & 0xffU) << 4);
LAB_001426c2:
    *(ushort *)((long)pvVar2 + (ulong)(uint)(iVar1 * y + x) * 2) = uVar3;
    break;
  case 7:
    *(uchar *)((long)pvVar2 + (ulong)(uint)((iVar1 * y + x) * 4)) = color.r;
    *(uchar *)((long)dst->data + (long)((dst->width * y + x) * 4) + 1) = color.g;
    *(uchar *)((long)dst->data + (long)((dst->width * y + x) * 4) + 2) = color.b;
    *(uchar *)((long)dst->data + (long)((y * dst->width + x) * 4) + 3) = color.a;
    break;
  case 8:
    *(float *)((long)pvVar2 + (ulong)(uint)(iVar1 * y + x) * 4) =
         ((float)(uVar4 & 0xff) / 255.0) * 0.114 +
         ((float)((uint)color & 0xff) / 255.0) * 0.299 + ((float)(uVar6 & 0xff) / 255.0) * 0.587;
    break;
  case 9:
    *(float *)((long)pvVar2 + (ulong)(uint)((iVar1 * y + x) * 3) * 4) =
         (float)((uint)color & 0xff) / 255.0;
    *(float *)((long)dst->data + (long)((dst->width * y + x) * 3) * 4 + 4) =
         (float)(uVar6 & 0xff) / 255.0;
    *(float *)((long)dst->data + (long)((y * dst->width + x) * 3) * 4 + 8) =
         (float)(uVar4 & 0xff) / 255.0;
    break;
  case 10:
    *(float *)((long)pvVar2 + (ulong)(uint)((iVar1 * y + x) * 4) * 4) =
         (float)((uint)color & 0xff) / 255.0;
    *(float *)((long)dst->data + (long)((dst->width * y + x) * 4 + 1) * 4) =
         (float)(uVar6 & 0xff) / 255.0;
    *(float *)((long)dst->data + (long)((dst->width * y + x) * 4 + 2) * 4) =
         (float)(uVar4 & 0xff) / 255.0;
    *(float *)((long)dst->data + (long)((y * dst->width + x) * 4 + 3) * 4) = (float)uVar5 / 255.0;
  }
  return;
}

Assistant:

void ImageDrawPixel(Image *dst, int x, int y, Color color)
{
    // Security check to avoid program crash
    if ((dst->data == NULL) || (x < 0) || (x >= dst->width) || (y < 0) || (y >= dst->height)) return;

    switch (dst->format)
    {
        case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dst->data)[y*dst->width + x] = gray;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dst->data)[(y*dst->width + x)*2] = gray;
            ((unsigned char *)dst->data)[(y*dst->width + x)*2 + 1] = color.a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
        {
            // NOTE: Calculate R5G6B5 equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*63.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));

            ((unsigned short *)dst->data)[y*dst->width + x] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*31.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));
            unsigned char a = (coln.w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;;

            ((unsigned short *)dst->data)[y*dst->width + x] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*15.0f));
            unsigned char g = (unsigned char)(round(coln.y*15.0f));
            unsigned char b = (unsigned char)(round(coln.z*15.0f));
            unsigned char a = (unsigned char)(round(coln.w*15.0f));

            ((unsigned short *)dst->data)[y*dst->width + x] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
        {
            ((unsigned char *)dst->data)[(y*dst->width + x)*3] = color.r;
            ((unsigned char *)dst->data)[(y*dst->width + x)*3 + 1] = color.g;
            ((unsigned char *)dst->data)[(y*dst->width + x)*3 + 2] = color.b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
        {
            ((unsigned char *)dst->data)[(y*dst->width + x)*4] = color.r;
            ((unsigned char *)dst->data)[(y*dst->width + x)*4 + 1] = color.g;
            ((unsigned char *)dst->data)[(y*dst->width + x)*4 + 2] = color.b;
            ((unsigned char *)dst->data)[(y*dst->width + x)*4 + 3] = color.a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R32:
        {
            // NOTE: Calculate grayscale equivalent color (normalized to 32bit)
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            ((float *)dst->data)[y*dst->width + x] = coln.x*0.299f + coln.y*0.587f + coln.z*0.114f;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
        {
            // NOTE: Calculate R32G32B32 equivalent color (normalized to 32bit)
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            ((float *)dst->data)[(y*dst->width + x)*3] = coln.x;
            ((float *)dst->data)[(y*dst->width + x)*3 + 1] = coln.y;
            ((float *)dst->data)[(y*dst->width + x)*3 + 2] = coln.z;
        } break;
        case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
        {
            // NOTE: Calculate R32G32B32A32 equivalent color (normalized to 32bit)
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            ((float *)dst->data)[(y*dst->width + x)*4] = coln.x;
            ((float *)dst->data)[(y*dst->width + x)*4 + 1] = coln.y;
            ((float *)dst->data)[(y*dst->width + x)*4 + 2] = coln.z;
            ((float *)dst->data)[(y*dst->width + x)*4 + 3] = coln.w;

        } break;
        default: break;
    }
}